

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

void __thiscall
duckdb::BatchedBufferedData::Append(BatchedBufferedData *this,DataChunk *to_append,idx_t batch)

{
  mutex *__mutex;
  _Base_ptr p_Var1;
  pointer pDVar2;
  Allocator *allocator;
  type other;
  idx_t iVar3;
  mapped_type *this_00;
  InternalException *this_01;
  allocator local_61;
  templated_unique_single_t chunk;
  idx_t batch_local;
  string local_50;
  
  batch_local = batch;
  make_uniq<duckdb::DataChunk>();
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&chunk);
  allocator = Allocator::DefaultAllocator();
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_50,to_append);
  DataChunk::Initialize(pDVar2,allocator,(vector<duckdb::LogicalType,_true> *)&local_50,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_50);
  other = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                    (&chunk);
  DataChunk::Copy(to_append,other,0);
  pDVar2 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (&chunk);
  iVar3 = DataChunk::GetAllocationSize(pDVar2);
  __mutex = &(this->super_BufferedData).glock;
  ::std::mutex::lock(__mutex);
  if (this->min_batch == batch) {
    p_Var1 = (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((_Rb_tree_header *)p_Var1 != &(this->buffer)._M_t._M_impl.super__Rb_tree_header) &&
       (*(ulong *)(p_Var1 + 1) < batch)) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_50,"Batches remaining in buffer",&local_61);
      InternalException::InternalException(this_01,&local_50);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::
    deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)&this->read_queue,&chunk);
    LOCK();
    (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i + iVar3;
    UNLOCK();
  }
  else {
    this_00 = ::std::
              map<unsigned_long,_duckdb::InProgressBatch,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::InProgressBatch>_>_>
              ::operator[](&this->buffer,&batch_local);
    this_00->completed = false;
    LOCK();
    (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i =
         (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i + iVar3;
    UNLOCK();
    ::std::
    deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((deque<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)this_00,&chunk);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            (&chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
  return;
}

Assistant:

void BatchedBufferedData::Append(const DataChunk &to_append, idx_t batch) {
	// We should never find any chunks with a smaller batch index than the minimum

	auto chunk = make_uniq<DataChunk>();
	chunk->Initialize(Allocator::DefaultAllocator(), to_append.GetTypes());
	to_append.Copy(*chunk, 0);
	auto allocation_size = chunk->GetAllocationSize();

	lock_guard<mutex> lock(glock);
	D_ASSERT(batch >= min_batch);
	auto is_minimum = IsMinimumBatchIndex(lock, batch);
	if (is_minimum) {
		for (auto &it : buffer) {
			auto batch_index = it.first;
			if (batch_index >= min_batch) {
				break;
			}
			// There should not be any batches in the buffer that are lower or equal to the minimum batch index
			throw InternalException("Batches remaining in buffer");
		}
		read_queue.push_back(std::move(chunk));
		read_queue_byte_count += allocation_size;
	} else {
		auto &in_progress_batch = buffer[batch];
		auto &chunks = in_progress_batch.chunks;
		in_progress_batch.completed = false;
		buffer_byte_count += allocation_size;
		chunks.push_back(std::move(chunk));
	}
}